

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Platform.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::PlatformInfoGen12::ValidateUnifiedAuxSurface(PlatformInfoGen12 *this,GMM_TEXTURE_INFO *Surf)

{
  GMM_TEXTURE_INFO *Surf_local;
  PlatformInfoGen12 *this_local;
  
  if ((((ulong)(Surf->Flags).Gpu >> 0x25 & 1) == 0) ||
     ((((((ulong)(Surf->Flags).Gpu >> 1 & 1) != 0 && ((Surf->MSAA).NumSamples < 2)) &&
       ((((ulong)(Surf->Flags).Gpu >> 0x17 & 1) != 0 ||
        (((ulong)(Surf->Flags).Gpu >> 0x22 & 1) != 0)))) ||
      (((((ulong)(Surf->Flags).Gpu >> 6 & 1) != 0 || (((ulong)(Surf->Flags).Gpu >> 0x1d & 1) != 0))
       || (1 < (Surf->MSAA).NumSamples)))))) {
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen12::ValidateUnifiedAuxSurface(GMM_TEXTURE_INFO &Surf)
{

    if ((Surf.Flags.Gpu.UnifiedAuxSurface) &&
        !( //--- Legitimate UnifiedAuxSurface Case ------------------------------------------
        (Surf.Flags.Gpu.CCS &&
         (Surf.MSAA.NumSamples <= 1 && (Surf.Flags.Gpu.RenderTarget || Surf.Flags.Gpu.Texture))) ||
        (Surf.Flags.Gpu.Depth || Surf.Flags.Gpu.SeparateStencil || Surf.MSAA.NumSamples > 1)))
    {
        GMM_ASSERTDPF(0, "Invalid UnifiedAuxSurface usage!");
        return 0;
    }

    return 1;
}